

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

QJsonDocument * __thiscall QShaderDescriptionPrivate::makeDoc(QShaderDescriptionPrivate *this)

{
  bool bVar1;
  Int IVar2;
  ulong uVar3;
  UniformBlock *pUVar4;
  PushConstantBlock *pPVar5;
  StorageBlock *pSVar6;
  reference pvVar7;
  array<unsigned_int,_3UL> *in_RSI;
  QJsonDocument *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  undefined1 auVar9 [16];
  InOutVariable *v_10;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1_10;
  InOutVariable *v_9;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1_9;
  size_t i;
  BuiltinVariable *v_8;
  add_const_t<QList<QShaderDescription::BuiltinVariable>_> *__range1_8;
  BuiltinVariable *v_7;
  add_const_t<QList<QShaderDescription::BuiltinVariable>_> *__range1_7;
  InOutVariable *v_6;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1_6;
  InOutVariable *v_5;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1_5;
  BlockVariable *v_4;
  QList<QShaderDescription::BlockVariable> *__range2_2;
  StorageBlock *b_2;
  QList<QShaderDescription::StorageBlock> *__range1_4;
  BlockVariable *v_3;
  QList<QShaderDescription::BlockVariable> *__range2_1;
  PushConstantBlock *b_1;
  QList<QShaderDescription::PushConstantBlock> *__range1_3;
  BlockVariable *v_2;
  QList<QShaderDescription::BlockVariable> *__range2;
  UniformBlock *b;
  QList<QShaderDescription::UniformBlock> *__range1_2;
  InOutVariable *v_1;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1_1;
  InOutVariable *v;
  add_const_t<QList<QShaderDescription::InOutVariable>_> *__range1;
  QJsonObject sampler_1;
  const_iterator __end1_10;
  const_iterator __begin1_10;
  QJsonArray jseparateSamplers;
  QJsonObject image_1;
  const_iterator __end1_9;
  const_iterator __begin1_9;
  QJsonArray jseparateImages;
  QJsonArray jlocalSize;
  const_iterator __end1_8;
  const_iterator __begin1_8;
  QJsonArray joutBuiltins;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  QJsonArray jinBuiltins;
  QJsonObject image;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  QJsonArray jstorageImages;
  QJsonObject sampler;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  QJsonArray jcombinedSamplers;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  QJsonArray members_2;
  QJsonObject jstorageBlock;
  iterator __end1_4;
  iterator __begin1_4;
  QJsonArray jstorageBlocks;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QJsonArray members_1;
  QJsonObject jpushConstantBlock;
  iterator __end1_3;
  iterator __begin1_3;
  QJsonArray jpushConstantBlocks;
  const_iterator __end2;
  const_iterator __begin2;
  QJsonArray members;
  QJsonObject juniformBlock;
  iterator __end1_2;
  iterator __begin1_2;
  QJsonArray juniformBlocks;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QJsonArray joutputs;
  const_iterator __end1;
  const_iterator __begin1;
  QJsonArray jinputs;
  QJsonObject root;
  QJsonDocument *__n;
  QLatin1String *local_ec8;
  InOutVariable *in_stack_fffffffffffff160;
  undefined1 in_stack_fffffffffffff168 [16];
  QLatin1String *local_e78;
  QLatin1StringView in_stack_fffffffffffff1b8;
  QLatin1StringView in_stack_fffffffffffff1c8;
  QLatin1String *local_e18;
  QLatin1String *local_df8;
  ulong local_dc8;
  QLatin1String *local_d60;
  QLatin1String *local_d10;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [24];
  undefined1 *local_aa8;
  InOutVariable *local_aa0;
  const_iterator local_a98;
  const_iterator local_a90;
  undefined1 *local_a88;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [24];
  undefined1 *local_a38;
  InOutVariable *local_a30;
  const_iterator local_a28;
  const_iterator local_a20;
  undefined1 *local_a18;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b8 [16];
  QJsonObject local_9a8 [8];
  BuiltinVariable *local_9a0;
  const_iterator local_998;
  const_iterator local_990;
  undefined1 *local_988;
  undefined1 local_980 [16];
  QJsonObject local_970 [8];
  BuiltinVariable *local_968;
  const_iterator local_960;
  const_iterator local_958;
  undefined1 *local_950;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [24];
  undefined1 *local_900;
  InOutVariable *local_8f8;
  const_iterator local_8f0;
  const_iterator local_8e8;
  undefined1 *local_8e0;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [24];
  undefined1 *local_890;
  InOutVariable *local_888;
  const_iterator local_880;
  const_iterator local_878;
  undefined1 *local_870;
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  QJsonObject local_848 [8];
  BlockVariable *local_840;
  const_iterator local_838;
  const_iterator local_830;
  undefined1 *local_828;
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [24];
  undefined1 local_7a8 [16];
  undefined1 local_798 [24];
  undefined1 *local_780;
  StorageBlock *local_778;
  iterator local_770;
  iterator local_768;
  undefined1 *local_760;
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  QJsonObject local_738 [8];
  BlockVariable *local_730;
  const_iterator local_728;
  const_iterator local_720;
  undefined1 *local_718;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [24];
  undefined1 *local_6d8;
  PushConstantBlock *local_6d0;
  iterator local_6c8;
  iterator local_6c0;
  undefined1 *local_6b8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  QJsonObject local_690 [8];
  BlockVariable *local_688;
  const_iterator local_680;
  const_iterator local_678;
  undefined1 *local_670;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [24];
  undefined1 local_610 [16];
  undefined1 local_600 [24];
  undefined1 *local_5e8;
  UniformBlock *local_5e0;
  iterator local_5d8;
  iterator local_5d0;
  undefined1 *local_5c8;
  undefined1 local_5c0 [16];
  QJsonObject local_5b0 [8];
  InOutVariable *local_5a8;
  const_iterator local_5a0;
  const_iterator local_598;
  undefined1 *local_590;
  undefined1 local_588 [16];
  QJsonObject local_578 [8];
  InOutVariable *local_570;
  const_iterator local_568;
  const_iterator local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  QJsonValue local_548 [24];
  QJsonValue local_530 [24];
  QJsonValue local_518 [24];
  QJsonValue local_500 [24];
  QJsonValue local_4e8 [24];
  QJsonValue local_4d0 [24];
  QJsonValue local_4b8 [24];
  QJsonValue local_4a0 [24];
  QJsonValue local_488 [24];
  QJsonValue local_470 [24];
  QJsonValue local_458 [24];
  QJsonValue local_440 [24];
  QJsonValue local_428 [24];
  QJsonValue local_410 [24];
  QJsonValue local_3f8 [24];
  QJsonValue local_3e0 [24];
  QJsonValue local_3c8 [24];
  QJsonValue local_3b0 [24];
  QJsonValue local_398 [24];
  QJsonValue local_380 [24];
  QJsonValue local_368 [24];
  QJsonValue local_350 [24];
  QJsonValue local_338 [24];
  QJsonValue local_320 [24];
  QJsonValue local_308 [24];
  QJsonValue local_2f0 [24];
  QJsonValue local_2d8 [24];
  QJsonValue local_2c0 [24];
  QJsonValue local_2a8 [24];
  QJsonValue local_290 [24];
  QJsonValue local_278 [24];
  QJsonValue local_260 [24];
  QJsonValue local_248 [24];
  QJsonValue local_230 [24];
  QJsonValue local_218 [24];
  QJsonValue local_200 [24];
  QJsonValue local_1e8 [24];
  QJsonValue local_1d0 [24];
  QJsonValue local_1b8 [24];
  QJsonValue local_1a0 [24];
  QJsonValue local_188 [24];
  QJsonValue local_170 [24];
  QJsonValue local_158 [24];
  QJsonValue local_140 [24];
  QJsonValue local_128 [24];
  QJsonValue local_110 [24];
  QJsonValue local_f8 [24];
  QJsonValue local_e0 [24];
  QJsonValue local_c8 [24];
  QJsonValue local_b0 [24];
  QJsonValue local_98 [24];
  QJsonValue local_80 [24];
  QJsonValue local_68 [24];
  QJsonValue local_50 [24];
  QJsonValue local_38 [24];
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_550 = &DAT_aaaaaaaaaaaaaaaa;
  __n = in_RDI;
  QJsonObject::QJsonObject((QJsonObject *)&local_550);
  local_558 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_558);
  local_560.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_560 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_568.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_568 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_570 = local_568.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_560,local_568);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_560);
    inOutObject(in_stack_fffffffffffff160);
    QJsonValue::QJsonValue(local_20,local_578);
    QJsonArray::append((QJsonValue *)&local_558);
    QJsonValue::~QJsonValue(local_20);
    QJsonObject::~QJsonObject(local_578);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_560);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_38,(QJsonArray *)&local_558);
    inputsKey();
    local_588 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_588,local_38);
    QJsonValue::~QJsonValue(local_38);
  }
  local_590 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_590);
  local_598.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_598 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_5a0.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_5a0 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_5a8 = local_5a0.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_598,local_5a0);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_598);
    inOutObject(in_stack_fffffffffffff160);
    QJsonValue::QJsonValue(local_50,local_5b0);
    QJsonArray::append((QJsonValue *)&local_590);
    QJsonValue::~QJsonValue(local_50);
    QJsonObject::~QJsonObject(local_5b0);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_598);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_68,(QJsonArray *)&local_590);
    outputsKey();
    local_5c0 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_5c0,local_68);
    QJsonValue::~QJsonValue(local_68);
  }
  local_5c8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_5c8);
  local_5d0.i = (UniformBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_5d0 = QList<QShaderDescription::UniformBlock>::begin
                        ((QList<QShaderDescription::UniformBlock> *)in_RDI);
  local_5d8.i = (UniformBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_5d8 = QList<QShaderDescription::UniformBlock>::end
                        ((QList<QShaderDescription::UniformBlock> *)in_RDI);
  while( true ) {
    local_5e0 = local_5d8.i;
    bVar1 = QList<QShaderDescription::UniformBlock>::iterator::operator!=(&local_5d0,local_5d8);
    if (!bVar1) break;
    pUVar4 = QList<QShaderDescription::UniformBlock>::iterator::operator*(&local_5d0);
    local_5e8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_5e8);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_80,(QString *)local_600);
    blockNameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
    local_610 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_610,local_80);
    QJsonValue::~QJsonValue(local_80);
    QString::~QString((QString *)0x6d9597);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_98,(QString *)local_628);
    structNameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
    local_638 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_638,local_98);
    QJsonValue::~QJsonValue(local_98);
    QString::~QString((QString *)0x6d9636);
    QJsonValue::QJsonValue(local_b0,pUVar4->size);
    sizeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
    local_648 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_648,local_b0);
    QJsonValue::~QJsonValue(local_b0);
    if (-1 < pUVar4->binding) {
      QJsonValue::QJsonValue(local_c8,pUVar4->binding);
      bindingKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
      local_658 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_658,local_c8);
      QJsonValue::~QJsonValue(local_c8);
    }
    if (-1 < pUVar4->descriptorSet) {
      QJsonValue::QJsonValue(local_e0,pUVar4->descriptorSet);
      setKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
      local_668 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_668,local_e0);
      QJsonValue::~QJsonValue(local_e0);
    }
    local_670 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_670);
    local_678.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_678 = QList<QShaderDescription::BlockVariable>::begin
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    local_680.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_680 = QList<QShaderDescription::BlockVariable>::end
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    while( true ) {
      local_688 = local_680.i;
      bVar1 = QList<QShaderDescription::BlockVariable>::const_iterator::operator!=
                        (&local_678,local_680);
      if (!bVar1) break;
      QList<QShaderDescription::BlockVariable>::const_iterator::operator*(&local_678);
      blockMemberObject((BlockVariable *)in_stack_fffffffffffff1c8.m_size);
      QJsonValue::QJsonValue(local_f8,local_690);
      QJsonArray::append((QJsonValue *)&local_670);
      QJsonValue::~QJsonValue(local_f8);
      QJsonObject::~QJsonObject(local_690);
      QList<QShaderDescription::BlockVariable>::const_iterator::operator++(&local_678);
    }
    QJsonValue::QJsonValue(local_110,(QJsonArray *)&local_670);
    membersKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_5e8);
    local_6a0 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_6a0,local_110);
    QJsonValue::~QJsonValue(local_110);
    QJsonValue::QJsonValue(local_128,(QJsonObject *)&local_5e8);
    QJsonArray::append((QJsonValue *)&local_5c8);
    QJsonValue::~QJsonValue(local_128);
    QJsonArray::~QJsonArray((QJsonArray *)&local_670);
    QJsonObject::~QJsonObject((QJsonObject *)&local_5e8);
    QList<QShaderDescription::UniformBlock>::iterator::operator++(&local_5d0);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_140,(QJsonArray *)&local_5c8);
    uniformBlocksKey();
    local_6b0 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_6b0,local_140);
    QJsonValue::~QJsonValue(local_140);
  }
  local_6b8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_6b8);
  local_6c0.i = (PushConstantBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_6c0 = QList<QShaderDescription::PushConstantBlock>::begin
                        ((QList<QShaderDescription::PushConstantBlock> *)in_RDI);
  local_6c8.i = (PushConstantBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_6c8 = QList<QShaderDescription::PushConstantBlock>::end
                        ((QList<QShaderDescription::PushConstantBlock> *)in_RDI);
  while( true ) {
    local_6d0 = local_6c8.i;
    bVar1 = QList<QShaderDescription::PushConstantBlock>::iterator::operator!=(&local_6c0,local_6c8)
    ;
    if (!bVar1) break;
    pPVar5 = QList<QShaderDescription::PushConstantBlock>::iterator::operator*(&local_6c0);
    local_6d8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_6d8);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_158,(QString *)local_6f0);
    nameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_6d8);
    local_700 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_700,local_158);
    QJsonValue::~QJsonValue(local_158);
    QString::~QString((QString *)0x6d9c09);
    QJsonValue::QJsonValue(local_170,pPVar5->size);
    sizeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_6d8);
    local_710 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_710,local_170);
    QJsonValue::~QJsonValue(local_170);
    local_718 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_718);
    local_720.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_720 = QList<QShaderDescription::BlockVariable>::begin
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    local_728.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_728 = QList<QShaderDescription::BlockVariable>::end
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    while( true ) {
      local_730 = local_728.i;
      bVar1 = QList<QShaderDescription::BlockVariable>::const_iterator::operator!=
                        (&local_720,local_728);
      if (!bVar1) break;
      QList<QShaderDescription::BlockVariable>::const_iterator::operator*(&local_720);
      blockMemberObject((BlockVariable *)in_stack_fffffffffffff1c8.m_size);
      QJsonValue::QJsonValue(local_188,local_738);
      QJsonArray::append((QJsonValue *)&local_718);
      QJsonValue::~QJsonValue(local_188);
      QJsonObject::~QJsonObject(local_738);
      QList<QShaderDescription::BlockVariable>::const_iterator::operator++(&local_720);
    }
    QJsonValue::QJsonValue(local_1a0,(QJsonArray *)&local_718);
    membersKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_6d8);
    local_748 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_748,local_1a0);
    QJsonValue::~QJsonValue(local_1a0);
    QJsonValue::QJsonValue(local_1b8,(QJsonObject *)&local_6d8);
    QJsonArray::append((QJsonValue *)&local_6b8);
    QJsonValue::~QJsonValue(local_1b8);
    QJsonArray::~QJsonArray((QJsonArray *)&local_718);
    QJsonObject::~QJsonObject((QJsonObject *)&local_6d8);
    QList<QShaderDescription::PushConstantBlock>::iterator::operator++(&local_6c0);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_1d0,(QJsonArray *)&local_6b8);
    pushConstantBlocksKey();
    local_758 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_758,local_1d0);
    QJsonValue::~QJsonValue(local_1d0);
  }
  local_760 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_760);
  local_768.i = (StorageBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_768 = QList<QShaderDescription::StorageBlock>::begin
                        ((QList<QShaderDescription::StorageBlock> *)in_RDI);
  local_770.i = (StorageBlock *)&DAT_aaaaaaaaaaaaaaaa;
  local_770 = QList<QShaderDescription::StorageBlock>::end
                        ((QList<QShaderDescription::StorageBlock> *)in_RDI);
  while( true ) {
    local_778 = local_770.i;
    bVar1 = QList<QShaderDescription::StorageBlock>::iterator::operator!=(&local_768,local_770);
    if (!bVar1) break;
    pSVar6 = QList<QShaderDescription::StorageBlock>::iterator::operator*(&local_768);
    local_780 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_780);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_1e8,(QString *)local_798);
    blockNameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
    local_7a8 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_7a8,local_1e8);
    QJsonValue::~QJsonValue(local_1e8);
    QString::~QString((QString *)0x6da0c8);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_200,(QString *)local_7c0);
    instanceNameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
    local_7d0 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_7d0,local_200);
    QJsonValue::~QJsonValue(local_200);
    QString::~QString((QString *)0x6da167);
    QJsonValue::QJsonValue(local_218,pSVar6->knownSize);
    knownSizeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
    local_7e0 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_7e0,local_218);
    QJsonValue::~QJsonValue(local_218);
    if (-1 < pSVar6->binding) {
      QJsonValue::QJsonValue(local_230,pSVar6->binding);
      bindingKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
      local_7f0 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_7f0,local_230);
      QJsonValue::~QJsonValue(local_230);
    }
    if (-1 < pSVar6->descriptorSet) {
      QJsonValue::QJsonValue(local_248,pSVar6->descriptorSet);
      setKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
      local_800 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_800,local_248);
      QJsonValue::~QJsonValue(local_248);
    }
    if (pSVar6->runtimeArrayStride != 0) {
      QJsonValue::QJsonValue(local_260,pSVar6->runtimeArrayStride);
      runtimeArrayStrideKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
      local_810 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_810,local_260);
      QJsonValue::~QJsonValue(local_260);
    }
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pSVar6->qualifierFlags);
    if (IVar2 != 0) {
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pSVar6->qualifierFlags);
      QJsonValue::QJsonValue(local_278,IVar2);
      qualifierFlagsKey();
      auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
      local_820 = auVar9;
      QJsonValueRef::operator=((QJsonValueRef *)local_820,local_278);
      QJsonValue::~QJsonValue(local_278);
    }
    local_828 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_828);
    local_830.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_830 = QList<QShaderDescription::BlockVariable>::begin
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    local_838.i = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
    local_838 = QList<QShaderDescription::BlockVariable>::end
                          ((QList<QShaderDescription::BlockVariable> *)in_RDI);
    while( true ) {
      local_840 = local_838.i;
      bVar1 = QList<QShaderDescription::BlockVariable>::const_iterator::operator!=
                        (&local_830,local_838);
      if (!bVar1) break;
      QList<QShaderDescription::BlockVariable>::const_iterator::operator*(&local_830);
      blockMemberObject((BlockVariable *)in_stack_fffffffffffff1c8.m_size);
      QJsonValue::QJsonValue(local_290,local_848);
      QJsonArray::append((QJsonValue *)&local_828);
      QJsonValue::~QJsonValue(local_290);
      QJsonObject::~QJsonObject(local_848);
      QList<QShaderDescription::BlockVariable>::const_iterator::operator++(&local_830);
    }
    QJsonValue::QJsonValue(local_2a8,(QJsonArray *)&local_828);
    membersKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_780);
    local_858 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_858,local_2a8);
    QJsonValue::~QJsonValue(local_2a8);
    QJsonValue::QJsonValue(local_2c0,(QJsonObject *)&local_780);
    QJsonArray::append((QJsonValue *)&local_760);
    QJsonValue::~QJsonValue(local_2c0);
    QJsonArray::~QJsonArray((QJsonArray *)&local_828);
    QJsonObject::~QJsonObject((QJsonObject *)&local_780);
    QList<QShaderDescription::StorageBlock>::iterator::operator++(&local_768);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_2d8,(QJsonArray *)&local_760);
    storageBlocksKey();
    local_868 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_868,local_2d8);
    QJsonValue::~QJsonValue(local_2d8);
  }
  local_870 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_870);
  local_878.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_878 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_880.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_880 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_888 = local_880.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_878,local_880);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_878);
    local_890 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_890);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_2f0,(QString *)local_8a8);
    nameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_890);
    local_8b8 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_8b8,local_2f0);
    QJsonValue::~QJsonValue(local_2f0);
    QString::~QString((QString *)0x6da864);
    QVar8 = typeStr((VariableType)((ulong)__n >> 0x20));
    local_d10 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_308,local_d10);
    typeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_890);
    local_8c8 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_8c8,local_308);
    QJsonValue::~QJsonValue(local_308);
    addDeco((QJsonObject *)in_stack_fffffffffffff1c8.m_size,
            (InOutVariable *)in_stack_fffffffffffff1b8.m_data);
    QJsonValue::QJsonValue(local_320,(QJsonObject *)&local_890);
    QJsonArray::append((QJsonValue *)&local_870);
    QJsonValue::~QJsonValue(local_320);
    QJsonObject::~QJsonObject((QJsonObject *)&local_890);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_878);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_338,(QJsonArray *)&local_870);
    combinedImageSamplersKey();
    local_8d8 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_8d8,local_338);
    QJsonValue::~QJsonValue(local_338);
  }
  local_8e0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_8e0);
  local_8e8.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_8e8 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_8f0.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_8f0 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_8f8 = local_8f0.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_8e8,local_8f0);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_8e8);
    local_900 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_900);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_350,(QString *)local_918);
    nameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_900);
    local_928 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_928,local_350);
    QJsonValue::~QJsonValue(local_350);
    QString::~QString((QString *)0x6dab8f);
    QVar8 = typeStr((VariableType)((ulong)__n >> 0x20));
    local_d60 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_368,local_d60);
    typeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_900);
    local_938 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_938,local_368);
    QJsonValue::~QJsonValue(local_368);
    addDeco((QJsonObject *)in_stack_fffffffffffff1c8.m_size,
            (InOutVariable *)in_stack_fffffffffffff1b8.m_data);
    QJsonValue::QJsonValue(local_380,(QJsonObject *)&local_900);
    QJsonArray::append((QJsonValue *)&local_8e0);
    QJsonValue::~QJsonValue(local_380);
    QJsonObject::~QJsonObject((QJsonObject *)&local_900);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_8e8);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_398,(QJsonArray *)&local_8e0);
    storageImagesKey();
    local_948 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_948,local_398);
    QJsonValue::~QJsonValue(local_398);
  }
  local_950 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_950);
  local_958.i = (BuiltinVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_958 = QList<QShaderDescription::BuiltinVariable>::begin
                        ((QList<QShaderDescription::BuiltinVariable> *)in_RDI);
  local_960.i = (BuiltinVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_960 = QList<QShaderDescription::BuiltinVariable>::end
                        ((QList<QShaderDescription::BuiltinVariable> *)in_RDI);
  while( true ) {
    local_968 = local_960.i;
    bVar1 = QList<QShaderDescription::BuiltinVariable>::const_iterator::operator!=
                      (&local_958,local_960);
    if (!bVar1) break;
    QList<QShaderDescription::BuiltinVariable>::const_iterator::operator*(&local_958);
    builtinObject(in_stack_fffffffffffff168._8_8_);
    QJsonValue::QJsonValue(local_3b0,local_970);
    QJsonArray::append((QJsonValue *)&local_950);
    QJsonValue::~QJsonValue(local_3b0);
    QJsonObject::~QJsonObject(local_970);
    QList<QShaderDescription::BuiltinVariable>::const_iterator::operator++(&local_958);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_3c8,(QJsonArray *)&local_950);
    inBuiltinsKey();
    local_980 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_980,local_3c8);
    QJsonValue::~QJsonValue(local_3c8);
  }
  local_988 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_988);
  local_990.i = (BuiltinVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_990 = QList<QShaderDescription::BuiltinVariable>::begin
                        ((QList<QShaderDescription::BuiltinVariable> *)in_RDI);
  local_998.i = (BuiltinVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_998 = QList<QShaderDescription::BuiltinVariable>::end
                        ((QList<QShaderDescription::BuiltinVariable> *)in_RDI);
  while( true ) {
    local_9a0 = local_998.i;
    bVar1 = QList<QShaderDescription::BuiltinVariable>::const_iterator::operator!=
                      (&local_990,local_998);
    if (!bVar1) break;
    QList<QShaderDescription::BuiltinVariable>::const_iterator::operator*(&local_990);
    builtinObject(in_stack_fffffffffffff168._8_8_);
    QJsonValue::QJsonValue(local_3e0,local_9a8);
    QJsonArray::append((QJsonValue *)&local_988);
    QJsonValue::~QJsonValue(local_3e0);
    QJsonObject::~QJsonObject(local_9a8);
    QList<QShaderDescription::BuiltinVariable>::const_iterator::operator++(&local_990);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_3f8,(QJsonArray *)&local_988);
    outBuiltinsKey();
    local_9b8 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_9b8,local_3f8);
    QJsonValue::~QJsonValue(local_3f8);
  }
  pvVar7 = std::array<unsigned_int,_3UL>::operator[](in_RSI,(size_type)__n);
  if (*pvVar7 == 0) {
    pvVar7 = std::array<unsigned_int,_3UL>::operator[](in_RSI,(size_type)__n);
    if (*pvVar7 == 0) {
      pvVar7 = std::array<unsigned_int,_3UL>::operator[](in_RSI,(size_type)__n);
      if (*pvVar7 == 0) goto LAB_006db238;
    }
  }
  local_9c0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_9c0);
  for (local_dc8 = 0; local_dc8 < 3; local_dc8 = local_dc8 + 1) {
    pvVar7 = std::array<unsigned_int,_3UL>::operator[](in_RSI,(size_type)__n);
    QJsonValue::QJsonValue(local_410,*pvVar7);
    QJsonArray::append((QJsonValue *)&local_9c0);
    QJsonValue::~QJsonValue(local_410);
  }
  QJsonValue::QJsonValue(local_428,(QJsonArray *)&local_9c0);
  computeLocalSizeKey();
  local_9d0 = QJsonObject::operator[]((QLatin1String *)&local_550);
  QJsonValueRef::operator=((QJsonValueRef *)local_9d0,local_428);
  QJsonValue::~QJsonValue(local_428);
  QJsonArray::~QJsonArray((QJsonArray *)&local_9c0);
LAB_006db238:
  if (in_RSI[0x17]._M_elems[2] != 0) {
    QJsonValue::QJsonValue(local_440,in_RSI[0x17]._M_elems[2]);
    tessellationOutputVertexCountKey();
    local_9e0 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_9e0,local_440);
    QJsonValue::~QJsonValue(local_440);
  }
  if (in_RSI[0x18]._M_elems[0] != 0) {
    QVar8 = tessModeStr((TessellationMode)((ulong)__n >> 0x20));
    local_df8 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_458,local_df8);
    tessellationModeKey();
    local_9f0 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_9f0,local_458);
    QJsonValue::~QJsonValue(local_458);
  }
  if (in_RSI[0x18]._M_elems[1] != 0) {
    QVar8 = tessWindStr((TessellationWindingOrder)((ulong)__n >> 0x20));
    local_e18 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_470,local_e18);
    tessellationWindingOrderKey();
    local_a00 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_a00,local_470);
    QJsonValue::~QJsonValue(local_470);
  }
  if (in_RSI[0x18]._M_elems[2] != 0) {
    in_stack_fffffffffffff1c8 = tessPartStr((TessellationPartitioning)((ulong)__n >> 0x20));
    QJsonValue::QJsonValue(local_488,(QLatin1String *)in_stack_fffffffffffff1c8.m_size);
    in_stack_fffffffffffff1b8 = tessellationPartitioningKey();
    local_a10 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_a10,local_488);
    QJsonValue::~QJsonValue(local_488);
  }
  local_a18 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a18);
  local_a20.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_a20 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_a28.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_a28 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_a30 = local_a28.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_a20,local_a28);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_a20);
    local_a38 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_a38);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_4a0,(QString *)local_a50);
    nameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_a38);
    local_a60 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_a60,local_4a0);
    QJsonValue::~QJsonValue(local_4a0);
    QString::~QString((QString *)0x6db670);
    QVar8 = typeStr((VariableType)((ulong)__n >> 0x20));
    local_e78 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_4b8,local_e78);
    typeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_a38);
    local_a70 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_a70,local_4b8);
    QJsonValue::~QJsonValue(local_4b8);
    addDeco((QJsonObject *)in_stack_fffffffffffff1c8.m_size,
            (InOutVariable *)in_stack_fffffffffffff1b8.m_data);
    QJsonValue::QJsonValue(local_4d0,(QJsonObject *)&local_a38);
    QJsonArray::append((QJsonValue *)&local_a18);
    QJsonValue::~QJsonValue(local_4d0);
    QJsonObject::~QJsonObject((QJsonObject *)&local_a38);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_a20);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_4e8,(QJsonArray *)&local_a18);
    separateImagesKey();
    local_a80 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_a80,local_4e8);
    QJsonValue::~QJsonValue(local_4e8);
  }
  local_a88 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a88);
  local_a90.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_a90 = QList<QShaderDescription::InOutVariable>::begin
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  local_a98.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_a98 = QList<QShaderDescription::InOutVariable>::end
                        ((QList<QShaderDescription::InOutVariable> *)in_RDI);
  while( true ) {
    local_aa0 = local_a98.i;
    bVar1 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                      (&local_a90,local_a98);
    if (!bVar1) break;
    QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_a90);
    local_aa8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_aa8);
    QString::fromUtf8<void>((QByteArray *)in_RDI);
    QJsonValue::QJsonValue(local_500,(QString *)local_ac0);
    nameKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_aa8);
    local_ad0 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_ad0,local_500);
    QJsonValue::~QJsonValue(local_500);
    QString::~QString((QString *)0x6db96e);
    QVar8 = typeStr((VariableType)((ulong)__n >> 0x20));
    local_ec8 = (QLatin1String *)QVar8.m_size;
    QJsonValue::QJsonValue(local_518,local_ec8);
    typeKey();
    auVar9 = QJsonObject::operator[]((QLatin1String *)&local_aa8);
    local_ae0 = auVar9;
    QJsonValueRef::operator=((QJsonValueRef *)local_ae0,local_518);
    QJsonValue::~QJsonValue(local_518);
    addDeco((QJsonObject *)in_stack_fffffffffffff1c8.m_size,
            (InOutVariable *)in_stack_fffffffffffff1b8.m_data);
    QJsonValue::QJsonValue(local_530,(QJsonObject *)&local_aa8);
    QJsonArray::append((QJsonValue *)&local_a88);
    QJsonValue::~QJsonValue(local_530);
    QJsonObject::~QJsonObject((QJsonObject *)&local_aa8);
    QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_a90);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_548,(QJsonArray *)&local_a88);
    separateSamplersKey();
    local_af0 = QJsonObject::operator[]((QLatin1String *)&local_550);
    QJsonValueRef::operator=((QJsonValueRef *)local_af0,local_548);
    QJsonValue::~QJsonValue(local_548);
  }
  QJsonDocument::QJsonDocument(in_RDI,(QJsonObject *)&local_550);
  QJsonArray::~QJsonArray((QJsonArray *)&local_a88);
  QJsonArray::~QJsonArray((QJsonArray *)&local_a18);
  QJsonArray::~QJsonArray((QJsonArray *)&local_988);
  QJsonArray::~QJsonArray((QJsonArray *)&local_950);
  QJsonArray::~QJsonArray((QJsonArray *)&local_8e0);
  QJsonArray::~QJsonArray((QJsonArray *)&local_870);
  QJsonArray::~QJsonArray((QJsonArray *)&local_760);
  QJsonArray::~QJsonArray((QJsonArray *)&local_6b8);
  QJsonArray::~QJsonArray((QJsonArray *)&local_5c8);
  QJsonArray::~QJsonArray((QJsonArray *)&local_590);
  QJsonArray::~QJsonArray((QJsonArray *)&local_558);
  QJsonObject::~QJsonObject((QJsonObject *)&local_550);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return __n;
  }
  __stack_chk_fail();
}

Assistant:

QJsonDocument QShaderDescriptionPrivate::makeDoc()
{
    QJsonObject root;

    QJsonArray jinputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(inVars))
        jinputs.append(inOutObject(v));
    if (!jinputs.isEmpty())
        root[inputsKey()] = jinputs;

    QJsonArray joutputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(outVars))
        joutputs.append(inOutObject(v));
    if (!joutputs.isEmpty())
        root[outputsKey()] = joutputs;

    QJsonArray juniformBlocks;
    for (const QShaderDescription::UniformBlock &b : uniformBlocks) {
        QJsonObject juniformBlock;
        juniformBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        juniformBlock[structNameKey()] = QString::fromUtf8(b.structName);
        juniformBlock[sizeKey()] = b.size;
        if (b.binding >= 0)
            juniformBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            juniformBlock[setKey()] = b.descriptorSet;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        juniformBlock[membersKey()] = members;
        juniformBlocks.append(juniformBlock);
    }
    if (!juniformBlocks.isEmpty())
        root[uniformBlocksKey()] = juniformBlocks;

    QJsonArray jpushConstantBlocks;
    for (const QShaderDescription::PushConstantBlock &b : pushConstantBlocks) {
        QJsonObject jpushConstantBlock;
        jpushConstantBlock[nameKey()] = QString::fromUtf8(b.name);
        jpushConstantBlock[sizeKey()] = b.size;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jpushConstantBlock[membersKey()] = members;
        jpushConstantBlocks.append(jpushConstantBlock);
    }
    if (!jpushConstantBlocks.isEmpty())
        root[pushConstantBlocksKey()] = jpushConstantBlocks;

    QJsonArray jstorageBlocks;
    for (const QShaderDescription::StorageBlock &b : storageBlocks) {
        QJsonObject jstorageBlock;
        jstorageBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        jstorageBlock[instanceNameKey()] = QString::fromUtf8(b.instanceName);
        jstorageBlock[knownSizeKey()] = b.knownSize;
        if (b.binding >= 0)
            jstorageBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            jstorageBlock[setKey()] = b.descriptorSet;
        if (b.runtimeArrayStride)
            jstorageBlock[runtimeArrayStrideKey()] = b.runtimeArrayStride;
        if (b.qualifierFlags)
            jstorageBlock[qualifierFlagsKey()] = int(b.qualifierFlags);
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jstorageBlock[membersKey()] = members;
        jstorageBlocks.append(jstorageBlock);
    }
    if (!jstorageBlocks.isEmpty())
        root[storageBlocksKey()] = jstorageBlocks;

    QJsonArray jcombinedSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(combinedImageSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jcombinedSamplers.append(sampler);
    }
    if (!jcombinedSamplers.isEmpty())
        root[combinedImageSamplersKey()] = jcombinedSamplers;

    QJsonArray jstorageImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(storageImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jstorageImages.append(image);
    }
    if (!jstorageImages.isEmpty())
        root[storageImagesKey()] = jstorageImages;

    QJsonArray jinBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(inBuiltins))
        jinBuiltins.append(builtinObject(v));
    if (!jinBuiltins.isEmpty())
        root[inBuiltinsKey()] = jinBuiltins;

    QJsonArray joutBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(outBuiltins))
        joutBuiltins.append(builtinObject(v));
    if (!joutBuiltins.isEmpty())
        root[outBuiltinsKey()] = joutBuiltins;

    if (localSize[0] || localSize[1] || localSize[2]) {
        QJsonArray jlocalSize;
        for (size_t i = 0; i < 3; ++i)
            jlocalSize.append(QJsonValue(int(localSize[i])));
        root[computeLocalSizeKey()] = jlocalSize;
    }

    if (tessOutVertCount)
        root[tessellationOutputVertexCountKey()] = int(tessOutVertCount);

    if (tessMode != QShaderDescription::UnknownTessellationMode)
        root[tessellationModeKey()] = tessModeStr(tessMode);

    if (tessWind != QShaderDescription::UnknownTessellationWindingOrder)
        root[tessellationWindingOrderKey()] = tessWindStr(tessWind);

    if (tessPart != QShaderDescription::UnknownTessellationPartitioning)
        root[tessellationPartitioningKey()] = tessPartStr(tessPart);

    QJsonArray jseparateImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jseparateImages.append(image);
    }
    if (!jseparateImages.isEmpty())
        root[separateImagesKey()] = jseparateImages;

    QJsonArray jseparateSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jseparateSamplers.append(sampler);
    }
    if (!jseparateSamplers.isEmpty())
        root[separateSamplersKey()] = jseparateSamplers;

    return QJsonDocument(root);
}